

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

void __thiscall
duckdb::ReservoirSample::Merge
          (ReservoirSample *this,
          unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
          *other)

{
  SamplingState SVar1;
  pointer pBVar2;
  ReservoirSample *this_00;
  pointer pRVar3;
  SelectionVector local_40;
  
  if ((this->super_BlockingSample).destroyed == false) {
    pBVar2 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
             operator->(other);
    if (pBVar2->destroyed != true) {
      pBVar2 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
               ::operator->(other);
      this_00 = BlockingSample::Cast<duckdb::ReservoirSample>(pBVar2);
      if ((this_00->reservoir_chunk).
          super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
          .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl !=
          (ReservoirChunk *)0x0) {
        pRVar3 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                 ::operator->(&this_00->reservoir_chunk);
        if ((pRVar3->chunk).count != 0) {
          if ((this->reservoir_chunk).
              super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
              .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl !=
              (ReservoirChunk *)0x0) {
            pRVar3 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                     ::operator->(&this->reservoir_chunk);
            if ((pRVar3->chunk).count != 0) {
              SVar1 = GetSamplingState(this);
              if (SVar1 == RANDOM) {
                SVar1 = GetSamplingState(this_00);
                if (SVar1 == RANDOM) {
                  SimpleMerge(this,this_00);
                  return;
                }
              }
              ConvertToReservoirSample(this);
              ConvertToReservoirSample(this_00);
              WeightedMerge(this,this_00);
              return;
            }
          }
          pBVar2 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                   ::operator->(other);
          ::std::
          __uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
          ::operator=((__uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
                       *)&(this->super_BlockingSample).base_reservoir_sample,
                      (__uniq_ptr_impl<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
                       *)&pBVar2->base_reservoir_sample);
          ::std::
          __uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>::
          operator=((__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>
                     *)&this->reservoir_chunk,
                    (__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>
                     *)&this_00->reservoir_chunk);
          SelectionVector::SelectionVector(&local_40,&this_00->sel);
          SelectionVector::operator=(&this->sel,&local_40);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_40.selection_data.internal.
                      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          this->sel_size = this_00->sel_size;
        }
      }
      return;
    }
  }
  (*(this->super_BlockingSample)._vptr_BlockingSample[5])(this);
  return;
}

Assistant:

void ReservoirSample::Merge(unique_ptr<BlockingSample> other) {
	if (destroyed || other->destroyed) {
		Destroy();
		return;
	}

	D_ASSERT(other->type == SampleType::RESERVOIR_SAMPLE);
	auto &other_sample = other->Cast<ReservoirSample>();

	// if the other sample has not collected anything yet return
	if (!other_sample.reservoir_chunk || other_sample.reservoir_chunk->chunk.size() == 0) {
		return;
	}

	// this has not collected samples, take over the other
	if (!reservoir_chunk || reservoir_chunk->chunk.size() == 0) {
		base_reservoir_sample = std::move(other->base_reservoir_sample);
		reservoir_chunk = std::move(other_sample.reservoir_chunk);
		sel = SelectionVector(other_sample.sel);
		sel_size = other_sample.sel_size;
		Verify();
		return;
	}
	//! Both samples are still in "fast sampling" method
	if (GetSamplingState() == SamplingState::RANDOM && other_sample.GetSamplingState() == SamplingState::RANDOM) {
		SimpleMerge(other_sample);
		return;
	}

	// One or none of the samples are in "Fast Sampling" method.
	// When this is the case, switch both to slow sampling
	ConvertToReservoirSample();
	other_sample.ConvertToReservoirSample();
	WeightedMerge(other_sample);
}